

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pmx.cpp
# Opt level: O0

void __thiscall pmx::PmxSetting::Read(PmxSetting *this,istream *stream)

{
  int local_20;
  undefined1 local_1a;
  byte local_19;
  int i;
  uint8_t temp;
  uint8_t count;
  istream *stream_local;
  PmxSetting *this_local;
  
  _i = stream;
  stream_local = (istream *)this;
  std::istream::read((char *)stream,(long)&local_19);
  if (local_19 < 8) {
    __cxa_rethrow();
  }
  std::istream::read((char *)_i,(long)this);
  std::istream::read((char *)_i,(long)&this->uv);
  std::istream::read((char *)_i,(long)&this->vertex_index_size);
  std::istream::read((char *)_i,(long)&this->texture_index_size);
  std::istream::read((char *)_i,(long)&this->material_index_size);
  std::istream::read((char *)_i,(long)&this->bone_index_size);
  std::istream::read((char *)_i,(long)&this->morph_index_size);
  std::istream::read((char *)_i,(long)&this->rigidbody_index_size);
  for (local_20 = 8; local_20 < (int)(uint)local_19; local_20 = local_20 + 1) {
    std::istream::read((char *)_i,(long)&local_1a);
  }
  return;
}

Assistant:

void PmxSetting::Read(std::istream *stream)
	{
		uint8_t count;
		stream->read((char*) &count, sizeof(uint8_t));
		if (count < 8)
		{
			throw;
		}
		stream->read((char*) &encoding, sizeof(uint8_t));
		stream->read((char*) &uv, sizeof(uint8_t));
		stream->read((char*) &vertex_index_size, sizeof(uint8_t));
		stream->read((char*) &texture_index_size, sizeof(uint8_t));
		stream->read((char*) &material_index_size, sizeof(uint8_t));
		stream->read((char*) &bone_index_size, sizeof(uint8_t));
		stream->read((char*) &morph_index_size, sizeof(uint8_t));
		stream->read((char*) &rigidbody_index_size, sizeof(uint8_t));
		uint8_t temp;
		for (int i = 8; i < count; i++)
		{
			stream->read((char*)&temp, sizeof(uint8_t));
		}
	}